

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_info.hpp
# Opt level: O2

vector<person,_std::allocator<person>_> *
lightconf::value_type_info<std::vector<person,_std::allocator<person>_>_>::extract_value
          (vector<person,_std::allocator<person>_> *__return_storage_ptr__,value *val)

{
  pointer pvVar1;
  return_type<std::vector<lightconf::value>_> pvVar2;
  pointer this;
  return_type<person> local_90;
  
  (__return_storage_ptr__->super__Vector_base<person,_std::allocator<person>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<person,_std::allocator<person>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<person,_std::allocator<person>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = value::get<std::vector<lightconf::value,std::allocator<lightconf::value>>>(val);
  pvVar1 = (pvVar2->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (this = (pvVar2->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
              _M_impl.super__Vector_impl_data._M_start; this != pvVar1; this = this + 1) {
    value::get<person>(&local_90,this);
    std::vector<person,_std::allocator<person>_>::emplace_back<person>
              (__return_storage_ptr__,&local_90);
    person::~person(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<U> extract_value(const value& val) {
        std::vector<U> v;
        const value_vector_type& inner_vals = val.get<value_vector_type>();
        for (const auto& u : inner_vals) {
            v.push_back(u.get<U>());
        }
        return v;
    }